

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool AdjustPolyCurve(ON_PolyCurve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ON_Curve *pOVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  ON_3dPointArray Points;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  iVar3 = ON_PolyCurve::Count(crv);
  if (iVar3 == 1) {
    bVar6 = 0;
    pOVar5 = ON_PolyCurve::SegmentCurve(crv,0);
    if (pOVar5 != (ON_Curve *)0x0) {
      bVar2 = AdjustCurve(pOVar5,P0,P1);
      return bVar2;
    }
  }
  else {
    iVar3 = ON_PolyCurve::Count(crv);
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,iVar3 + 1);
    ON_Curve::PointAtStart(&local_48,&crv->super_ON_Curve);
    ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    iVar3 = 0;
    while( true ) {
      iVar4 = ON_PolyCurve::Count(crv);
      if (iVar4 <= iVar3) break;
      pOVar5 = ON_PolyCurve::SegmentCurve(crv,iVar3);
      ON_Curve::PointAtEnd(&local_48,pOVar5);
      ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
      iVar3 = iVar3 + 1;
    }
    bVar2 = AdjustPointListAlongChord((ON_3dPointArray *)&local_60,P0,P1);
    if (bVar2) {
      lVar8 = 0x18;
      lVar7 = 0;
      bVar6 = 0;
      while( true ) {
        iVar3 = ON_PolyCurve::Count(crv);
        if (iVar3 <= lVar7) break;
        pOVar5 = ON_PolyCurve::SegmentCurve(crv,(int)lVar7);
        if (pOVar5 == (ON_Curve *)0x0) break;
        bVar2 = AdjustCurve(pOVar5,(ON_3dPoint *)((long)&local_60.m_a[-1].x + lVar8),
                            (ON_3dPoint *)((long)&(local_60.m_a)->x + lVar8));
        ON_Curve::PointAtEnd(&local_48,pOVar5);
        if (bVar2) {
          bVar6 = 1;
        }
        *(double *)((long)&(local_60.m_a)->z + lVar8) = local_48.z;
        pdVar1 = (double *)((long)&(local_60.m_a)->x + lVar8);
        *pdVar1 = local_48.x;
        pdVar1[1] = local_48.y;
        lVar8 = lVar8 + 0x18;
        lVar7 = lVar7 + 1;
      }
    }
    else {
      iVar3 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(crv);
      bVar6 = 1;
      if ((char)iVar3 == '\0') {
        iVar3 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])
                          (crv);
        bVar6 = (byte)iVar3;
      }
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

static bool AdjustPolyCurve(ON_PolyCurve& crv,
                             const ON_3dPoint& P0, 
                             const ON_3dPoint& P1)

{
  if (crv.Count() == 1){
    ON_Curve* pSeg = crv.SegmentCurve(0);
    if (!pSeg)
      return false;
    return AdjustCurve(*pSeg, P0, P1);
  }

  ON_3dPointArray Points(crv.Count() + 1);
  Points.Append(crv.PointAtStart());

  int i;
  for (i=0; i<crv.Count(); i++)
    Points.Append(crv.SegmentCurve(i)->PointAtEnd());

  if (!AdjustPointListAlongChord(Points, P0, P1)){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  bool rc = false;
  for (i=0; i<crv.Count(); i++){
    ON_Curve* pSeg = crv.SegmentCurve(i);
    if (!pSeg)
      return rc;
    if (AdjustCurve(*pSeg, Points[i], Points[i+1]))
      rc = true;
    Points[i+1] = pSeg->PointAtEnd();
  }

  return rc;
}